

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O1

void ParseFunctionDef(FScanner *sc,PClassActor *cls,FName *funcname,TArray<PType_*,_PType_*> *rets,
                     DWORD funcflags)

{
  int iVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  bool bVar6;
  PFunction *this;
  PPrototype *proto;
  PSymbol *pPVar7;
  PColor **ppPVar8;
  PClass *restrict;
  PClassPointer *type;
  FxExpression *pFVar9;
  uint uVar10;
  TArray<unsigned_int,_unsigned_int> argflags;
  TArray<PType_*,_PType_*> args;
  undefined1 local_78 [16];
  undefined1 local_68 [12];
  uint uStack_5c;
  TArray<PType_*,_PType_*> local_58;
  FString local_48;
  AFuncDesc *local_40;
  FString local_38;
  
  local_78._12_4_ = funcflags;
  local_38.Chars = (char *)rets;
  if (cls == (PClassActor *)0x0) {
    __assert_fail("cls != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                  ,0x1c5,
                  "void ParseFunctionDef(FScanner &, PClassActor *, FName, TArray<PType *> &, DWORD)"
                 );
  }
  local_58.Array = (PType **)0x0;
  local_58.Most = 0;
  local_58.Count = 0;
  local_68._0_8_ = (uint *)0x0;
  stack0xffffffffffffffa0 = 0.0;
  local_48.Chars = (char *)funcname;
  local_40 = FindFunction(FName::NameData.NameArray[funcname->Index].Text);
  if (local_40 == (AFuncDesc *)0x0) {
    FScanner::ScriptMessage
              (sc,"The function \'%s\' has not been exported from the executable.",
               FName::NameData.NameArray[*(int *)local_48.Chars].Text);
    FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
  }
  FScanner::MustGetToken(sc,0x28);
  SetImplicitArgs(&local_58,(TArray<unsigned_int,_unsigned_int> *)local_68,cls,local_78._12_4_);
  bVar6 = FScanner::CheckToken(sc,0x29);
  if ((!bVar6) && (sc->TokenType != 0x29)) {
    do {
      do {
        do {
          bVar6 = FScanner::CheckToken(sc,0x168);
        } while (bVar6);
        bVar6 = FScanner::CheckToken(sc,0x153);
      } while (bVar6);
      FScanner::MustGetAnyToken(sc);
      iVar1 = sc->TokenType;
      switch(iVar1) {
      case 0x132:
        ppPVar8 = (PColor **)&TypeBool;
        break;
      case 0x133:
        ppPVar8 = (PColor **)&TypeFloat64;
        break;
      case 0x134:
      case 0x135:
      case 0x136:
      case 0x137:
      case 0x138:
      case 0x139:
      case 0x13b:
      case 0x13c:
      case 0x13d:
      case 0x13e:
      case 0x13f:
      case 0x141:
      case 0x142:
switchD_00674621_caseD_134:
        FScanner::TokenName((FScanner *)local_78,iVar1,sc->String);
        FScanner::ScriptMessage
                  (sc,"Unknown variable type %s",CONCAT44(local_78._4_4_,local_78._0_4_));
        FString::~FString((FString *)local_78);
        FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
        type = (PClassPointer *)TypeSInt32;
        goto LAB_00674729;
      case 0x13a:
        ppPVar8 = (PColor **)&TypeSInt32;
        break;
      case 0x140:
        FScanner::MustGetToken(sc,0x3c);
        FScanner::MustGetToken(sc,0x101);
        local_78._0_4_ = FName::NameManager::FindName(&FName::NameData,sc->String,true);
        restrict = PClass::FindClass((FName *)local_78);
        if (restrict == (PClass *)0x0) {
          FScanner::ScriptMessage(sc,"Unknown class type %s",sc->String);
          FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
          type = (PClassPointer *)0x0;
        }
        else {
          type = NewClassPointer(restrict);
        }
        FScanner::MustGetToken(sc,0x3e);
        goto LAB_00674729;
      case 0x143:
        ppPVar8 = (PColor **)&TypeName;
        break;
      case 0x144:
        ppPVar8 = (PColor **)&TypeString;
        break;
      case 0x145:
        ppPVar8 = (PColor **)&TypeSound;
        break;
      case 0x146:
        ppPVar8 = (PColor **)&TypeState;
        break;
      case 0x147:
        ppPVar8 = &TypeColor;
        break;
      default:
        if (iVar1 != 0x10a) goto switchD_00674621_caseD_134;
        FScanner::MustGetToken(sc,0x29);
        FScanner::UnGet(sc);
        type = (PClassPointer *)0x0;
        goto LAB_00674729;
      }
      type = (PClassPointer *)*ppPVar8;
LAB_00674729:
      bVar6 = FScanner::CheckToken(sc,0x2c);
      if ((bVar6) || (bVar6 = FScanner::CheckToken(sc,0x29), bVar6)) {
        FScanner::UnGet(sc);
      }
      else {
        FScanner::MustGetToken(sc,0x101);
      }
      bVar6 = FScanner::CheckToken(sc,0x3d);
      uVar10 = 0;
      if (bVar6) {
        pFVar9 = ParseParameter(sc,cls,(PType *)type,true);
        uVar10 = 1;
        if (pFVar9 != (FxExpression *)0x0) {
          (*pFVar9->_vptr_FxExpression[1])(pFVar9);
        }
      }
      TArray<PType_*,_PType_*>::Grow(&local_58,1);
      local_58.Array[local_58.Count] = (PType *)type;
      local_58.Count = local_58.Count + 1;
      TArray<unsigned_int,_unsigned_int>::Grow((TArray<unsigned_int,_unsigned_int> *)local_68,1);
      *(uint *)(local_68._0_8_ + (ulong)uStack_5c * 4) = uVar10;
      stack0xffffffffffffffa0 = (double)CONCAT44(uStack_5c + 1,local_68._8_4_);
      FScanner::MustGetAnyToken(sc);
      iVar1 = sc->TokenType;
      if ((iVar1 != 0x29) && (iVar1 != 0x2c)) {
        FScanner::TokenName((FScanner *)local_78,iVar1,sc->String);
        FScanner::ScriptError
                  (sc,"Expected \',\' or \')\' but got %s instead",
                   CONCAT44(local_78._4_4_,local_78._0_4_));
        FString::~FString((FString *)local_78);
      }
    } while (sc->TokenType != 0x29);
  }
  FScanner::MustGetToken(sc,0x3b);
  if (local_40 != (AFuncDesc *)0x0) {
    this = (PFunction *)
           M_Malloc_Dbg(0x40,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/./dobject.h"
                        ,0x1f7);
    cVar2 = local_48.Chars[0];
    cVar3 = local_48.Chars[1];
    cVar4 = local_48.Chars[2];
    cVar5 = local_48.Chars[3];
    DObject::DObject((DObject *)this);
    (this->super_PSymbol).super_DObject.field_0x24 = cVar2;
    (this->super_PSymbol).super_DObject.field_0x25 = cVar3;
    (this->super_PSymbol).super_DObject.field_0x26 = cVar4;
    (this->super_PSymbol).super_DObject.field_0x27 = cVar5;
    (this->super_PSymbol).super_DObject._vptr_DObject = (_func_int **)&PTR_StaticType_008478f0;
    (this->Variants).Array = (Variant *)0x0;
    (this->Variants).Most = 0;
    (this->Variants).Count = 0;
    this->Flags = 0;
    proto = NewPrototype((TArray<PType_*,_PType_*> *)local_38.Chars,&local_58);
    PFunction::AddVariant
              (this,proto,(TArray<unsigned_int,_unsigned_int> *)local_68,
               &(*local_40->VMPointer)->super_VMFunction);
    this->Flags = local_78._12_4_;
    pPVar7 = PSymbolTable::AddSymbol
                       (&(cls->super_PClass).super_PStruct.super_PNamedType.super_PCompoundType.
                         super_PType.Symbols,(PSymbol *)this);
    if (pPVar7 == (PSymbol *)0x0) {
      (*(this->super_PSymbol).super_DObject._vptr_DObject[2])(this);
      FScanner::ScriptMessage
                (sc,"\'%s\' is already defined in class \'%s\'.",
                 FName::NameData.NameArray[*(int *)local_48.Chars].Text,
                 FName::NameData.NameArray
                 [(cls->super_PClass).super_PStruct.super_PNamedType.TypeName.Index].Text);
      FScriptPosition::ErrorCounter = FScriptPosition::ErrorCounter + 1;
    }
  }
  TArray<unsigned_int,_unsigned_int>::~TArray((TArray<unsigned_int,_unsigned_int> *)local_68);
  TArray<PType_*,_PType_*>::~TArray(&local_58);
  return;
}

Assistant:

void ParseFunctionDef(FScanner &sc, PClassActor *cls, FName funcname,
	TArray<PType *> &rets, DWORD funcflags)
{
	assert(cls != NULL);

	const AFuncDesc *afd;
	TArray<PType *> args;
	TArray<DWORD> argflags;

	afd = FindFunction(funcname);
	if (afd == NULL)
	{
		sc.ScriptMessage ("The function '%s' has not been exported from the executable.", funcname.GetChars());
		FScriptPosition::ErrorCounter++;
	}
	sc.MustGetToken('(');

	SetImplicitArgs(&args, &argflags, cls, funcflags);
	ParseArgListDef(sc, cls, args, argflags);

	if (afd != NULL)
	{
		PFunction *sym = new PFunction(funcname);
		sym->AddVariant(NewPrototype(rets, args), argflags, *(afd->VMPointer));
		sym->Flags = funcflags;
		if (cls->Symbols.AddSymbol(sym) == NULL)
		{
			delete sym;
			sc.ScriptMessage ("'%s' is already defined in class '%s'.",
				funcname.GetChars(), cls->TypeName.GetChars());
			FScriptPosition::ErrorCounter++;
		}
	}
}